

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.c
# Opt level: O1

int ThreadPoolSetAttr(ThreadPool *tp,ThreadPoolAttr *attr)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  size_t sVar5;
  PolicyType in;
  int iVar6;
  int local_40;
  int local_3c;
  int local_38;
  undefined4 local_34;
  
  if (tp == (ThreadPool *)0x0) {
    iVar2 = 0x16;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)tp);
    if (attr == (ThreadPoolAttr *)0x0) {
      iVar4 = 1;
      local_38 = 10000;
      local_3c = 10;
      piVar3 = &maxJobsTotal;
      local_40 = 500;
      in = 0;
      sVar5 = 0;
      iVar2 = 10;
    }
    else {
      iVar4 = attr->minThreads;
      iVar2 = attr->maxThreads;
      sVar5 = attr->stackSize;
      local_38 = attr->maxIdleTime;
      local_3c = attr->jobsPerThread;
      piVar3 = &attr->maxJobsTotal;
      local_40 = attr->starvationTime;
      in = attr->schedPolicy;
      local_34 = *(undefined4 *)&attr->field_0x24;
    }
    iVar6 = *piVar3;
    iVar1 = SetPolicyType(in);
    if (iVar1 == 0) {
      (tp->attr).minThreads = iVar4;
      (tp->attr).maxThreads = iVar2;
      (tp->attr).stackSize = sVar5;
      (tp->attr).maxIdleTime = local_38;
      (tp->attr).jobsPerThread = local_3c;
      (tp->attr).maxJobsTotal = iVar6;
      (tp->attr).starvationTime = local_40;
      (tp->attr).schedPolicy = in;
      *(undefined4 *)&(tp->attr).field_0x24 = local_34;
      iVar6 = tp->totalThreads;
      iVar2 = 0;
      if (iVar6 < iVar4) {
        while ((iVar2 = 0, iVar6 < (tp->attr).minThreads && (iVar2 = CreateWorker(tp), iVar2 == 0)))
        {
          iVar6 = iVar6 + 1;
        }
      }
      pthread_cond_signal((pthread_cond_t *)&tp->condition);
      pthread_mutex_unlock((pthread_mutex_t *)tp);
      if (iVar2 != 0) {
        ThreadPoolShutdown(tp);
      }
    }
    else {
      pthread_mutex_unlock((pthread_mutex_t *)tp);
      iVar2 = 0x20000000;
    }
  }
  return iVar2;
}

Assistant:

int ThreadPoolSetAttr(ThreadPool *tp, ThreadPoolAttr *attr)
{
	int retCode = 0;
	ThreadPoolAttr temp;
	int i = 0;

	if (!tp)
		return EINVAL;

	ithread_mutex_lock(&tp->mutex);

	if (attr)
		temp = *attr;
	else
		TPAttrInit(&temp);
	if (SetPolicyType(temp.schedPolicy) != 0) {
		ithread_mutex_unlock(&tp->mutex);
		return INVALID_POLICY;
	}
	tp->attr = temp;
	/* add threads */
	if (tp->totalThreads < tp->attr.minThreads) {
		for (i = tp->totalThreads; i < tp->attr.minThreads; i++) {
			retCode = CreateWorker(tp);
			if (retCode != 0) {
				break;
			}
		}
	}
	/* signal changes */
	ithread_cond_signal(&tp->condition);

	ithread_mutex_unlock(&tp->mutex);

	if (retCode != 0)
		/* clean up if the min threads could not be created */
		ThreadPoolShutdown(tp);

	return retCode;
}